

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TThreadsFactory.cpp
# Opt level: O2

void * ThreadHelper(void *context)

{
  void *__retval;
  TThreadsFactory *this;
  
  __retval = (void *)(**context)();
  this = TThreadsFactory::GetInstance(false);
  TThreadsFactory::ResetThread(this,*(uint *)((long)context + 0x10));
  operator_delete(context,0x20);
  pthread_exit(__retval);
}

Assistant:

void * ThreadHelper(void * context)
{
    void * ret;
    TThreadContext * threadContext = reinterpret_cast<TThreadContext *>(context);

    ret = threadContext->fFunction(threadContext->fArgument);

    /* We're done with user thread
     * It's time to finish ourselves and to release resources
     */
    TThreadsFactory::GetInstance()->ResetThread(threadContext->fId);
    delete threadContext;

    pthread_exit(ret);
    return ret;
}